

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int32_t __thiscall
aeron::archive::AeronArchive::listRecordings
          (AeronArchive *this,int64_t fromRecordingId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  int32_t local_5c;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  int64_t local_38;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_5c = recordCount;
  local_38 = fromRecordingId;
  local_58._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_58._M_unused._0_8_ = this;
  *(int64_t **)((long)local_58._M_unused._0_8_ + 8) = &local_38;
  *(int32_t **)((long)local_58._M_unused._0_8_ + 0x10) = &local_5c;
  pcStack_40 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:249:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:249:9)>
             ::_M_manager;
  iVar1 = callAndPollForDescriptors
                    (this,(function<bool_(long)> *)&local_58,recordCount,consumer,"list recordings")
  ;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecordings(std::int64_t fromRecordingId, std::int32_t recordCount,
                                          RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->listRecordings(fromRecordingId, recordCount, correlationId, controlSessionId_);
        },
        recordCount, std::move(consumer), "list recordings");
}